

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  stbi__uint32 x;
  stbi__uint32 y;
  int iVar3;
  stbi__context *s;
  stbi__context *psVar4;
  bool bVar5;
  uint len;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  stbi_uc sVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint color;
  stbi_uc **ppsVar21;
  stbi_uc *psVar22;
  stbi_uc *psVar23;
  size_t sVar24;
  byte *pbVar25;
  bool bVar26;
  uint uVar27;
  ulong uVar28;
  stbi_uc *psVar29;
  byte bVar30;
  uint uVar31;
  int c;
  ulong uVar32;
  uint uVar33;
  stbi__uint32 raw_len_00;
  long lVar34;
  stbi_uc *psVar35;
  size_t __size;
  long lVar36;
  int local_52c;
  ulong local_4e0;
  stbi__uint32 raw_len;
  stbi_uc tc [3];
  ulong local_488;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar13 = stbi__check_png_header(s);
  if (iVar13 == 0) {
    local_52c = 0;
  }
  else {
    local_52c = 1;
    if (scan != 1) {
      ppsVar21 = &z->idata;
      psVar1 = s->buffer_start;
      psVar2 = s->buffer_start + 1;
      bVar6 = true;
      bVar12 = 0;
      color = 0;
      bVar7 = false;
      local_4e0 = 0;
      __size = 0;
      len = 0;
      bVar8 = false;
      bVar30 = 0;
      do {
        iVar13 = stbi__get16be(s);
        uVar14 = stbi__get16be(s);
        uVar17 = iVar13 * 0x10000 + uVar14;
        uVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        uVar31 = uVar15 << 0x10 | uVar16;
        uVar18 = (uint)local_4e0;
        if ((int)uVar31 < 0x49484452) {
          if (uVar31 == 0x43674249) {
            bVar7 = true;
LAB_0010f25f:
            stbi__skip(s,uVar17);
LAB_0010f5bc:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar5 = true;
          }
          else if (uVar31 == 0x49444154) {
            if (bVar6) {
LAB_0010f336:
              stbi__g_failure_reason = "first not IHDR";
              bVar6 = true;
              goto LAB_0010f34e;
            }
            if ((bVar30 != 0) && (uVar18 == 0)) {
              stbi__g_failure_reason = "no PLTE";
              bVar6 = false;
              local_4e0 = 0;
              goto LAB_0010f34e;
            }
            if (scan == 2) {
              s->img_n = (uint)bVar30;
              local_52c = 1;
              bVar6 = false;
              goto LAB_00110094;
            }
            uVar14 = uVar17 + len;
            if ((int)len <= (int)uVar14) {
              if ((uint)__size < uVar14) {
                sVar24 = 0x1000;
                if (0x1000 < uVar17) {
                  sVar24 = (ulong)uVar17;
                }
                if ((uint)__size != 0) {
                  sVar24 = __size;
                }
                do {
                  __size = sVar24;
                  sVar24 = (ulong)((uint)__size * 2);
                } while ((uint)__size < uVar14);
                psVar22 = (stbi_uc *)realloc(*ppsVar21,__size);
                if (psVar22 == (stbi_uc *)0x0) {
                  stbi__g_failure_reason = "outofmem";
                  goto LAB_0010fede;
                }
                *ppsVar21 = psVar22;
              }
              iVar13 = stbi__getn(s,*ppsVar21 + len,uVar17);
              if (iVar13 != 0) {
                bVar6 = false;
                len = uVar14;
                goto LAB_0010f5bc;
              }
              stbi__g_failure_reason = "outofdata";
            }
LAB_0010fede:
            bVar6 = false;
            local_52c = 0;
            bVar5 = false;
          }
          else {
            if (uVar31 != 0x49454e44) {
LAB_0010f297:
              if (bVar6) goto LAB_0010f336;
              bVar6 = false;
              if ((uVar15 >> 0xd & 1) == 0) {
                stbi__parse_png_file::invalid_chunk[0] = (char)(uVar31 >> 0x18);
                stbi__parse_png_file::invalid_chunk[1] = (char)(uVar31 >> 0x10);
                stbi__parse_png_file::invalid_chunk[2] = (char)(uVar16 >> 8);
                stbi__parse_png_file::invalid_chunk[3] = (char)uVar16;
                stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
                goto LAB_0010f5da;
              }
              goto LAB_0010f25f;
            }
            if (bVar6) {
              stbi__g_failure_reason = "first not IHDR";
LAB_0010f19c:
              local_52c = 0;
            }
            else if (scan == 0) {
              if (*ppsVar21 == (stbi_uc *)0x0) {
                stbi__g_failure_reason = "no IDAT";
                goto LAB_0010f19c;
              }
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar22 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar21,len,raw_len,(int *)&raw_len,(uint)!bVar7);
              z->expanded = psVar22;
              local_52c = 0;
              if (psVar22 != (stbi_uc *)0x0) {
                free(*ppsVar21);
                raw_len_00 = raw_len;
                *ppsVar21 = (stbi_uc *)0x0;
                iVar13 = s->img_n + 1;
                if (bVar8 || (bVar30 == 0 && req_comp != 3) && iVar13 == req_comp) {
                  s->img_out_n = iVar13;
                }
                else {
                  s->img_out_n = s->img_n;
                }
                psVar22 = z->expanded;
                iVar13 = s->img_out_n;
                iVar20 = z->depth;
                x = z->s->img_x;
                y = z->s->img_y;
                if (bVar12 == 0) {
                  iVar13 = stbi__create_png_image_raw(z,psVar22,raw_len,iVar13,x,y,iVar20,color);
                  if (iVar13 == 0) goto LAB_00110094;
                }
                else {
                  c = iVar13 << (iVar20 == 0x10);
                  psVar23 = (stbi_uc *)stbi__malloc_mad3(x,y,c,0);
                  sVar24 = (size_t)c;
                  lVar34 = 0;
                  do {
                    psVar4 = z->s;
                    uVar17 = (&DAT_00116b00)[lVar34];
                    uVar14 = (&DAT_00116b40)[lVar34];
                    uVar33 = ~uVar17 + psVar4->img_x + uVar14;
                    uVar18 = uVar33 / uVar14;
                    uVar15 = (&DAT_00116b20)[lVar34];
                    uVar16 = (&DAT_00116b60)[lVar34];
                    uVar27 = ~uVar15 + psVar4->img_y + uVar16;
                    uVar31 = uVar27 / uVar16;
                    bVar5 = true;
                    if ((uVar14 <= uVar33) && (uVar16 <= uVar27)) {
                      iVar3 = psVar4->img_n;
                      iVar19 = stbi__create_png_image_raw
                                         (z,psVar22,raw_len_00,iVar13,uVar18,uVar31,iVar20,color);
                      if (iVar19 == 0) {
                        free(psVar23);
                        bVar5 = false;
                      }
                      else {
                        if (0 < (int)uVar31) {
                          iVar19 = uVar15 * c;
                          local_488 = 0;
                          do {
                            if (0 < (int)uVar18) {
                              psVar4 = z->s;
                              psVar29 = z->out;
                              lVar36 = 0;
                              psVar35 = psVar23 + (long)(int)uVar17 * sVar24;
                              do {
                                memcpy(psVar35 + psVar4->img_x * iVar19,
                                       psVar29 + (lVar36 + local_488 * (long)(int)uVar18) * sVar24,
                                       sVar24);
                                lVar36 = lVar36 + 1;
                                psVar35 = psVar35 + (long)(int)uVar14 * sVar24;
                              } while (lVar36 < (int)uVar18);
                            }
                            local_488 = local_488 + 1;
                            iVar19 = iVar19 + uVar16 * c;
                          } while (local_488 < uVar31);
                        }
                        uVar31 = (((int)(uVar18 * iVar20 * iVar3 + 7) >> 3) + 1) * uVar31;
                        free(z->out);
                        psVar22 = psVar22 + uVar31;
                        raw_len_00 = raw_len_00 - uVar31;
                        bVar5 = true;
                      }
                    }
                    if (!bVar5) goto LAB_00110094;
                    lVar34 = lVar34 + 1;
                  } while (lVar34 != 7);
                  z->out = psVar23;
                }
                if (bVar8) {
                  if (z->depth == 0x10) {
                    stbi__compute_transparency16(z,tc16,s->img_out_n);
                  }
                  else {
                    stbi__compute_transparency(z,tc,s->img_out_n);
                  }
                }
                if (((bVar7) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                  stbi__de_iphone(z);
                }
                if (bVar30 == 0) {
                  if (bVar8) {
                    s->img_n = s->img_n + 1;
                  }
                }
                else {
                  s->img_n = (uint)bVar30;
                  uVar17 = (uint)bVar30;
                  if (2 < req_comp) {
                    uVar17 = req_comp;
                  }
                  s->img_out_n = uVar17;
                  psVar22 = z->out;
                  uVar14 = z->s->img_y * z->s->img_x;
                  psVar23 = (stbi_uc *)stbi__malloc_mad2(uVar14,uVar17,0);
                  if (psVar23 == (stbi_uc *)0x0) {
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    if (uVar17 == 3) {
                      if (uVar14 != 0) {
                        uVar28 = 0;
                        psVar29 = psVar23;
                        do {
                          uVar32 = (ulong)psVar22[uVar28];
                          *psVar29 = palette[uVar32 * 4];
                          psVar29[1] = palette[uVar32 * 4 + 1];
                          psVar29[2] = palette[uVar32 * 4 + 2];
                          psVar29 = psVar29 + 3;
                          uVar28 = uVar28 + 1;
                        } while (uVar14 != uVar28);
                      }
                    }
                    else if (uVar14 != 0) {
                      uVar28 = 0;
                      do {
                        *(undefined4 *)(psVar23 + uVar28 * 4) =
                             *(undefined4 *)(palette + (ulong)psVar22[uVar28] * 4);
                        uVar28 = uVar28 + 1;
                      } while (uVar14 != uVar28);
                    }
                    free(psVar22);
                    z->out = psVar23;
                  }
                  if (psVar23 == (stbi_uc *)0x0) goto LAB_00110094;
                }
                free(z->expanded);
                z->expanded = (stbi_uc *)0x0;
                goto LAB_0010f3a4;
              }
            }
            else {
LAB_0010f3a4:
              local_52c = 1;
            }
LAB_00110094:
            bVar5 = false;
          }
        }
        else if (uVar31 == 0x74524e53) {
          if (bVar6) {
            stbi__g_failure_reason = "first not IHDR";
            bVar6 = true;
LAB_0010f382:
            local_52c = 0;
          }
          else {
            if (*ppsVar21 != (stbi_uc *)0x0) {
              stbi__g_failure_reason = "tRNS after IDAT";
LAB_0010f371:
              bVar6 = false;
              goto LAB_0010f382;
            }
            if (bVar30 == 0) {
              if ((s->img_n & 1U) == 0) {
                stbi__g_failure_reason = "tRNS with alpha";
              }
              else {
                if (s->img_n * 2 == uVar17) {
                  bVar8 = true;
                  if (z->depth == 0x10) {
                    if (0 < s->img_n) {
                      lVar34 = 0;
                      do {
                        iVar13 = stbi__get16be(s);
                        tc16[lVar34] = (stbi__uint16)iVar13;
                        lVar34 = lVar34 + 1;
                      } while (lVar34 < s->img_n);
                    }
                  }
                  else if (0 < s->img_n) {
                    lVar34 = 0;
                    do {
                      iVar13 = stbi__get16be(s);
                      tc[lVar34] = ""[z->depth] * (char)iVar13;
                      lVar34 = lVar34 + 1;
                    } while (lVar34 < s->img_n);
                  }
                  bVar6 = false;
                  bVar30 = 0;
                  goto LAB_0010f5bc;
                }
                stbi__g_failure_reason = "bad tRNS len";
              }
              bVar6 = false;
              bVar30 = 0;
              goto LAB_0010f34e;
            }
            if (scan != 2) {
              if (uVar18 == 0) {
                stbi__g_failure_reason = "tRNS before PLTE";
                bVar6 = false;
                local_4e0 = 0;
                goto LAB_0010f382;
              }
              if (uVar17 <= uVar18) {
                bVar6 = false;
                bVar30 = 4;
                if (uVar17 != 0) {
                  uVar28 = 0;
                  do {
                    psVar22 = s->img_buffer;
                    if (psVar22 < s->img_buffer_end) {
LAB_0010fc9a:
                      s->img_buffer = psVar22 + 1;
                      sVar11 = *psVar22;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar20 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                        if (iVar20 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar2;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar1;
                          s->img_buffer_end = psVar1 + iVar20;
                        }
                        psVar22 = s->img_buffer;
                        goto LAB_0010fc9a;
                      }
                      sVar11 = '\0';
                    }
                    palette[uVar28 * 4 + 3] = sVar11;
                    uVar28 = uVar28 + 1;
                    bVar30 = 4;
                  } while (uVar14 + iVar13 * 0x10000 != uVar28);
                }
                goto LAB_0010f5bc;
              }
              stbi__g_failure_reason = "bad tRNS len";
              goto LAB_0010f371;
            }
            s->img_n = 4;
            local_52c = 1;
            bVar6 = false;
          }
          bVar5 = false;
        }
        else {
          if (uVar31 == 0x504c5445) {
            if (bVar6) goto LAB_0010f336;
            if ((uVar17 < 0x301) &&
               (local_4e0 = (ulong)uVar14 * 0x55555556 >> 0x20,
               (int)((ulong)uVar14 * 0x55555556 >> 0x20) * 3 == uVar17)) {
              bVar6 = false;
              if (2 < uVar14) {
                uVar28 = 0;
                do {
                  psVar22 = s->img_buffer;
                  if (psVar22 < s->img_buffer_end) {
LAB_0010f46f:
                    s->img_buffer = psVar22 + 1;
                    sVar11 = *psVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar13 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar2;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar13;
                      }
                      psVar22 = s->img_buffer;
                      goto LAB_0010f46f;
                    }
                    sVar11 = '\0';
                  }
                  palette[uVar28 * 4] = sVar11;
                  psVar22 = s->img_buffer;
                  if (psVar22 < s->img_buffer_end) {
LAB_0010f4e9:
                    s->img_buffer = psVar22 + 1;
                    sVar11 = *psVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar13 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar2;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar13;
                      }
                      psVar22 = s->img_buffer;
                      goto LAB_0010f4e9;
                    }
                    sVar11 = '\0';
                  }
                  palette[uVar28 * 4 + 1] = sVar11;
                  psVar22 = s->img_buffer;
                  if (psVar22 < s->img_buffer_end) {
LAB_0010f563:
                    s->img_buffer = psVar22 + 1;
                    sVar11 = *psVar22;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar13 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar2;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar1;
                        s->img_buffer_end = psVar1 + iVar13;
                      }
                      psVar22 = s->img_buffer;
                      goto LAB_0010f563;
                    }
                    sVar11 = '\0';
                  }
                  palette[uVar28 * 4 + 2] = sVar11;
                  palette[uVar28 * 4 + 3] = 0xff;
                  uVar28 = uVar28 + 1;
                } while (local_4e0 != uVar28);
              }
              goto LAB_0010f5bc;
            }
            stbi__g_failure_reason = "invalid PLTE";
LAB_0010f5da:
            bVar6 = false;
LAB_0010f34e:
            bVar5 = false;
            local_52c = 0;
            goto LAB_00110096;
          }
          if (uVar31 != 0x49484452) goto LAB_0010f297;
          if (bVar6) {
            if (uVar17 != 0xd) {
              stbi__g_failure_reason = "bad IHDR len";
              goto LAB_0010f59f;
            }
            iVar13 = stbi__get16be(s);
            uVar17 = stbi__get16be(s);
            uVar17 = uVar17 | iVar13 << 0x10;
            s->img_x = uVar17;
            if (0x1000000 < uVar17) {
LAB_0010f241:
              stbi__g_failure_reason = "too large";
              goto LAB_0010f59f;
            }
            iVar13 = stbi__get16be(s);
            uVar17 = stbi__get16be(s);
            uVar17 = uVar17 | iVar13 << 0x10;
            s->img_y = uVar17;
            if (0x1000000 < uVar17) goto LAB_0010f241;
            pbVar25 = s->img_buffer;
            if (pbVar25 < s->img_buffer_end) {
LAB_0010fde7:
              s->img_buffer = pbVar25 + 1;
              bVar10 = *pbVar25;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar2;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar1 + iVar13;
                }
                pbVar25 = s->img_buffer;
                goto LAB_0010fde7;
              }
              bVar10 = 0;
            }
            z->depth = (uint)bVar10;
            if ((0x10 < bVar10) || ((0x10116U >> (bVar10 & 0x1f) & 1) == 0)) {
              stbi__g_failure_reason = "1/2/4/8/16-bit only";
              goto LAB_0010f59f;
            }
            pbVar25 = s->img_buffer;
            if (pbVar25 < s->img_buffer_end) {
LAB_0010ff19:
              s->img_buffer = pbVar25 + 1;
              bVar10 = *pbVar25;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar2;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar1;
                  s->img_buffer_end = psVar1 + iVar13;
                }
                pbVar25 = s->img_buffer;
                goto LAB_0010ff19;
              }
              bVar10 = 0;
            }
            color = (uint)bVar10;
            if (bVar10 < 7) {
              if (bVar10 != 3) {
                bVar9 = bVar30;
                if ((bVar10 & 1) == 0) goto LAB_0010ff90;
                goto LAB_0010ff44;
              }
              bVar9 = 3;
              if (z->depth == 0x10) {
                color = 3;
                goto LAB_0010ff44;
              }
LAB_0010ff90:
              bVar30 = bVar9;
              psVar22 = s->img_buffer;
              if (psVar22 < s->img_buffer_end) {
LAB_001100d9:
                s->img_buffer = psVar22 + 1;
                if (*psVar22 == '\0') goto LAB_001100f5;
                stbi__g_failure_reason = "bad comp method";
LAB_0011017f:
                bVar26 = false;
                local_52c = 0;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                  if (iVar13 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar1;
                    s->img_buffer_end = psVar2;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar1;
                    s->img_buffer_end = psVar1 + iVar13;
                  }
                  psVar22 = s->img_buffer;
                  goto LAB_001100d9;
                }
LAB_001100f5:
                sVar11 = stbi__get8(s);
                if (sVar11 != '\0') {
                  stbi__g_failure_reason = "bad filter method";
                  goto LAB_0011017f;
                }
                bVar12 = stbi__get8(s);
                if (1 < bVar12) {
                  stbi__g_failure_reason = "bad interlace method";
                  goto LAB_0011017f;
                }
                uVar17 = s->img_x;
                if ((uVar17 == 0) || (uVar14 = s->img_y, uVar14 == 0)) {
                  stbi__g_failure_reason = "0-pixel image";
                  goto LAB_0011017f;
                }
                if (bVar30 == 0) {
                  uVar15 = (3 < bVar10) + 1 + (bVar10 & 2);
                  s->img_n = uVar15;
                  if ((uint)((0x40000000 / (ulong)uVar17) / (ulong)uVar15) < uVar14) {
                    stbi__g_failure_reason = "too large";
                    bVar30 = 0;
                    goto LAB_0010f59f;
                  }
                  if (scan != 2) goto LAB_00110207;
                  local_52c = 1;
                  bVar26 = false;
                  bVar30 = 0;
                }
                else {
                  s->img_n = 1;
                  if ((uint)(0x40000000 / (ulong)uVar17 >> 2) < uVar14) {
                    stbi__g_failure_reason = "too large";
                    goto LAB_0010f59f;
                  }
LAB_00110207:
                  bVar26 = true;
                }
              }
            }
            else {
LAB_0010ff44:
              stbi__g_failure_reason = "bad ctype";
              bVar26 = false;
              local_52c = 0;
            }
          }
          else {
            stbi__g_failure_reason = "multiple IHDR";
LAB_0010f59f:
            bVar26 = false;
            local_52c = 0;
          }
          bVar6 = false;
          bVar5 = false;
          if (bVar26) goto LAB_0010f5bc;
        }
LAB_00110096:
      } while (bVar5);
    }
  }
  return local_52c;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}